

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O3

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::MidSideNodeIndices
          (TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,int side,
          TPZVec<long> *indices)

{
  TPZReference *pTVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int64_t iVar8;
  TPZVec<TPZGeoElSideIndex> nodeIndexes;
  TPZAutoPointer<TPZRefPattern> local_168;
  TPZVec<TPZGeoElSideIndex> local_160;
  undefined **local_140;
  undefined1 *local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined1 local_120 [240];
  
  pTVar1 = (this->fRefPattern).fRef;
  if ((((pTVar1 != (TPZReference *)0x0) && (pTVar1->fPointer != (TPZRefPattern *)0x0)) &&
      (iVar2 = (**(code **)(*(long *)&(this->
                                      super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>
                                      ).super_TPZGeoEl + 0x1d0))(), iVar2 != 0)) &&
     (iVar2 = (**(code **)(*(long *)&(this->
                                     super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>
                                     ).super_TPZGeoEl + 0x98))(this), iVar2 <= side)) {
    local_140 = &PTR__TPZManVector_0181aa68;
    lVar3 = 0x30;
    do {
      *(undefined ***)((long)&local_160.fNElements + lVar3) = &PTR__TPZGeoElSide_018f8760;
      *(undefined8 *)((long)&local_160.fNAlloc + lVar3) = 0;
      *(undefined4 *)((long)&local_140 + lVar3) = 0xffffffff;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x120);
    local_138 = local_120;
    local_130 = 0;
    uStack_128 = 0;
    local_160._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018827f0;
    local_160.fStore = (TPZGeoElSideIndex *)0x0;
    local_160.fNElements = 0;
    local_160.fNAlloc = 0;
    (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>)
                           .super_TPZGeoEl + 0x2b0))(&local_168,this);
    TPZRefPattern::InternalNodesIndexes((local_168.fRef)->fPointer,side,&local_160);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&local_168);
    iVar8 = local_160.fNElements;
    (*indices->_vptr_TPZVec[3])(indices,local_160.fNElements);
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    else {
      lVar3 = 1;
      lVar7 = 0;
      do {
        plVar4 = (long *)(**(code **)(*(long *)&(this->
                                                super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>
                                                ).super_TPZGeoEl + 0x1f8))
                                   (this,*(int *)&(&(local_160.fStore)->super_TPZSavable)[lVar3].
                                                  _vptr_TPZSavable + -1);
        iVar2 = (int)(&(local_160.fStore)->fGeoElIndex)[lVar3];
        iVar6 = iVar2;
        if ((&(local_160.fStore)->super_TPZSavable)[lVar3]._vptr_TPZSavable ==
            (_func_int **)0xffffffffffffffff) {
          iVar6 = -1;
        }
        if (iVar2 == -1) {
          iVar6 = -1;
        }
        lVar5 = (**(code **)(*plVar4 + 0xa8))(plVar4,iVar6);
        indices->fStore[lVar7] = lVar5;
        lVar7 = lVar7 + 1;
        lVar3 = lVar3 + 3;
      } while (iVar8 != lVar7);
    }
    (*indices->_vptr_TPZVec[3])(indices,iVar8);
    local_160._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018827f0;
    if (local_160.fStore != (TPZGeoElSideIndex *)0x0) {
      operator_delete__(&local_160.fStore[-1].fSide,*(long *)&local_160.fStore[-1].fSide * 0x18 + 8)
      ;
    }
    if (local_138 != local_120) {
      uStack_128 = 0;
      local_140 = &PTR__TPZVec_018141b0;
      if (local_138 != (undefined1 *)0x0) {
        operator_delete__(local_138 + -8,*(long *)(local_138 + -8) * 0x18 + 8);
      }
    }
    return;
  }
  (*indices->_vptr_TPZVec[3])(indices,0);
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::MidSideNodeIndices(int side,TPZVec<int64_t> &indices) const{
	if(!fRefPattern || !HasSubElement() || side < this->NCornerNodes()) {
		indices.Resize(0);
		return;
	}
	TPZManVector<TPZGeoElSide> gelsides;
	TPZVec<TPZGeoElSideIndex> nodeIndexes;
	this->GetRefPattern()->InternalNodesIndexes(side, nodeIndexes);
	
	int64_t nsub = nodeIndexes.NElements();
	indices.Resize(nsub);
	int64_t is;
	int64_t counter = 0;
	for(is=0; is<nsub; is++)
	{
		TPZGeoEl *subel = SubElement(nodeIndexes[is].ElementIndex() - 1);
		indices[counter] = subel->NodeIndex(nodeIndexes[is].Side());
		counter++;
	}
	indices.Resize(counter);
}